

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O1

int Vec_IntGetEntry(Vec_Int_t *p,int i)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  
  if (i < p->nSize) goto LAB_003f6ec3;
  iVar3 = i + 1;
  iVar1 = p->nCap;
  iVar4 = iVar1 * 2;
  if (i < iVar4) {
    if (iVar1 < iVar4 && iVar1 <= i) {
      if (p->pArray == (int *)0x0) {
        piVar2 = (int *)malloc((long)iVar1 << 3);
      }
      else {
        piVar2 = (int *)realloc(p->pArray,(long)iVar1 << 3);
      }
      p->pArray = piVar2;
LAB_003f6e91:
      if (piVar2 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      p->nCap = iVar4;
    }
  }
  else if (iVar1 <= i) {
    if (p->pArray == (int *)0x0) {
      piVar2 = (int *)malloc((long)iVar3 << 2);
    }
    else {
      piVar2 = (int *)realloc(p->pArray,(long)iVar3 << 2);
    }
    p->pArray = piVar2;
    iVar4 = iVar3;
    goto LAB_003f6e91;
  }
  iVar1 = p->nSize;
  if (iVar1 <= i) {
    memset(p->pArray + iVar1,0,(ulong)(uint)(i - iVar1) * 4 + 4);
  }
  p->nSize = iVar3;
LAB_003f6ec3:
  if ((-1 < i) && (i < p->nSize)) {
    return p->pArray[(uint)i];
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int Vec_IntGetEntry( Vec_Int_t * p, int i )
{
    Vec_IntFillExtra( p, i + 1, 0 );
    return Vec_IntEntry( p, i );
}